

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<osqp::(anonymous_namespace)::ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test>
::CreateTest(ParameterizedTestFactory<osqp::(anonymous_namespace)::ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test>
             *this)

{
  undefined8 *puVar1;
  
  WithParamInterface<bool>::parameter_ = &this->parameter_;
  puVar1 = (undefined8 *)operator_new(0x20);
  *puVar1 = &PTR__WithParamInterface_00207d50;
  Test::Test((Test *)(puVar1 + 1));
  puVar1[3] = 0;
  *puVar1 = &PTR__ParameterizedTwoDimensionalQpTest_00206c40;
  puVar1[1] = &
              PTR__ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test_00206c68
  ;
  return (Test *)(puVar1 + 1);
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }